

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
* __thiscall
AddrManImpl::Select_
          (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           *__return_storage_ptr__,AddrManImpl *this,bool new_only,optional<Network> network)

{
  FastRandomContext *this_00;
  ulong uVar1;
  _Hash_node_base *p_Var2;
  uint uVar3;
  double dVar4;
  CService *pCVar5;
  string_view source_file;
  int (*paiVar6) [64];
  bool bVar7;
  bool bVar8;
  uint uVar9;
  Network NVar10;
  uint64_t uVar11;
  __node_base_ptr p_Var12;
  CService *pCVar13;
  __node_base_ptr p_Var14;
  time_point tVar15;
  Logger *pLVar16;
  _Storage<Network,_true> _Var17;
  uint uVar18;
  char *pcVar19;
  ulong uVar20;
  int iVar21;
  uint64_t maxval;
  long lVar22;
  __node_base_ptr p_Var23;
  int bits;
  char *in_R8;
  int iVar24;
  uint uVar25;
  __node_base_ptr p_Var26;
  CService *unaff_R15;
  long in_FS_OFFSET;
  double dVar27;
  undefined1 auVar28 [16];
  string_view str;
  string_view logging_function;
  string log_msg;
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [7];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
LAB_0085d59b:
    CService::CService((CService *)__return_storage_ptr__);
    (__return_storage_ptr__->first).nTime.__d.__r = 100000000;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0085d746;
    (__return_storage_ptr__->first).nServices = NODE_NONE;
    (__return_storage_ptr__->second).__d.__r = 0;
  }
  else {
    lVar22 = (long)this->nNew;
    p_Var26 = (__node_base_ptr)(long)this->nTried;
    _Var17._M_value =
         network.super__Optional_base<Network,_true,_true>._M_payload.
         super__Optional_payload_base<Network>._M_payload;
    if (((ulong)network.super__Optional_base<Network,_true,_true>._M_payload.
                super__Optional_payload_base<Network> >> 0x20 & 1) == 0) {
LAB_0085ce4e:
      if ((new_only && lVar22 == 0) || (lVar22 == -(long)p_Var26)) goto LAB_0085d59b;
      bVar7 = !new_only && p_Var26 != (__node_base_ptr)0x0;
      if ((!new_only && p_Var26 != (__node_base_ptr)0x0) && (lVar22 != 0)) {
        uVar11 = RandomMixin<FastRandomContext>::randbits<1>
                           (&(this->insecure_rand).super_RandomMixin<FastRandomContext>);
        bVar7 = uVar11 != 0;
      }
      this_00 = &this->insecure_rand;
      p_Var23 = (__node_base_ptr)0x3ff;
      if (bVar7) {
        p_Var23 = (__node_base_ptr)0xff;
      }
      pcVar19 = "new";
      if (bVar7) {
        pcVar19 = "tried";
      }
      uVar3 = 0x1f;
      if ((uint)p_Var23 != 0) {
        for (; (uint)p_Var23 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      dVar4 = 1.0;
      do {
        do {
          p_Var12 = (__node_base_ptr)
                    RandomMixin<FastRandomContext>::randbits
                              (&this_00->super_RandomMixin<FastRandomContext>,
                               (uVar3 ^ 0xffffffe0) + 0x21);
          p_Var14 = p_Var26;
          if (p_Var12 <= p_Var23) {
            p_Var14 = p_Var12;
          }
          p_Var26 = (__node_base_ptr)((ulong)p_Var14 & 0xffffffff);
        } while (p_Var23 < p_Var12);
        do {
          pCVar13 = (CService *)
                    RandomMixin<FastRandomContext>::randbits
                              (&this_00->super_RandomMixin<FastRandomContext>,6);
          pCVar5 = unaff_R15;
          if ((CService *)0x3f >= pCVar13) {
            pCVar5 = pCVar13;
          }
          unaff_R15 = (CService *)((ulong)pCVar5 & 0xffffffff);
        } while ((CService *)0x3f < pCVar13);
        uVar25 = (uint)p_Var14;
        iVar24 = 0;
        do {
          uVar18 = iVar24 + (int)pCVar5;
          uVar9 = iVar24 + 0x3f + (int)pCVar5;
          if (-1 < (int)uVar18) {
            uVar9 = uVar18;
          }
          uVar18 = uVar18 - (uVar9 & 0xffffffc0);
          if (bVar7) {
            iVar21 = -1;
            paiVar6 = this->vvTried;
            if (uVar25 < 0x100) {
joined_r0x0085cfb7:
              iVar21 = -1;
              if (uVar18 < 0x40) {
                iVar21 = paiVar6[(int)uVar25][(int)uVar18];
              }
            }
          }
          else {
            iVar21 = -1;
            paiVar6 = this->vvNew;
            if (uVar25 < 0x400) goto joined_r0x0085cfb7;
          }
          if (iVar21 != -1) {
            if (((ulong)network.super__Optional_base<Network,_true,_true>._M_payload.
                        super__Optional_payload_base<Network> >> 0x20 & 1) == 0) goto LAB_0085d07f;
            uVar1 = (this->mapInfo)._M_h._M_bucket_count;
            uVar20 = (ulong)(long)iVar21 % uVar1;
            p_Var14 = (this->mapInfo)._M_h._M_buckets[uVar20];
            p_Var12 = (__node_base_ptr)0x0;
            if ((p_Var14 != (__node_base_ptr)0x0) &&
               (in_R8 = (char *)p_Var14->_M_nxt, p_Var12 = p_Var14, p_Var14 = (__node_base_ptr)in_R8
               , iVar21 != *(int *)&((__node_base_ptr)((long)in_R8 + 8))->_M_nxt)) {
              while (in_R8 = (char *)p_Var14->_M_nxt, (__node_base_ptr)in_R8 != (__node_base_ptr)0x0
                    ) {
                p_Var12 = (__node_base_ptr)0x0;
                if (((ulong)(long)*(int *)&((__node_base_ptr)((long)in_R8 + 8))->_M_nxt % uVar1 !=
                     uVar20) ||
                   (p_Var12 = p_Var14, p_Var14 = (__node_base_ptr)in_R8,
                   iVar21 == *(int *)&((__node_base_ptr)((long)in_R8 + 8))->_M_nxt))
                goto LAB_0085d03d;
              }
              p_Var12 = (__node_base_ptr)0x0;
            }
LAB_0085d03d:
            if (p_Var12 == (__node_base_ptr)0x0) {
              p_Var14 = (__node_base_ptr)0x0;
            }
            else {
              p_Var14 = p_Var12->_M_nxt;
            }
            if ((p_Var14 != (__node_base_ptr)0x0) &&
               (NVar10 = CNetAddr::GetNetwork((CNetAddr *)(p_Var14 + 2)), NVar10 == _Var17._M_value)
               ) goto LAB_0085d07f;
          }
          iVar24 = iVar24 + 1;
        } while (iVar24 != 0x40);
        iVar24 = 0x40;
LAB_0085d07f:
        bVar8 = false;
        if (iVar24 != 0x40) {
          uVar1 = (this->mapInfo)._M_h._M_bucket_count;
          uVar20 = (ulong)(long)iVar21 % uVar1;
          p_Var26 = (this->mapInfo)._M_h._M_buckets[uVar20];
          p_Var14 = (__node_base_ptr)0x0;
          if ((p_Var26 != (__node_base_ptr)0x0) &&
             (in_R8 = (char *)p_Var26->_M_nxt, p_Var14 = p_Var26, p_Var26 = (__node_base_ptr)in_R8,
             iVar21 != *(int *)&((__node_base_ptr)((long)in_R8 + 8))->_M_nxt)) {
            while (in_R8 = (char *)p_Var26->_M_nxt, (__node_base_ptr)in_R8 != (__node_base_ptr)0x0)
            {
              p_Var14 = (__node_base_ptr)0x0;
              if (((ulong)(long)*(int *)&((__node_base_ptr)((long)in_R8 + 8))->_M_nxt % uVar1 !=
                   uVar20) ||
                 (p_Var14 = p_Var26, p_Var26 = (__node_base_ptr)in_R8,
                 iVar21 == *(int *)&((__node_base_ptr)((long)in_R8 + 8))->_M_nxt))
              goto LAB_0085d0f6;
            }
            p_Var14 = (__node_base_ptr)0x0;
          }
LAB_0085d0f6:
          if (p_Var14 == (__node_base_ptr)0x0) {
            p_Var26 = (__node_base_ptr)0x0;
          }
          else {
            p_Var26 = p_Var14->_M_nxt;
          }
          if (p_Var26 == (__node_base_ptr)0x0) {
            __assert_fail("it_found != mapInfo.end()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                          ,0x307,
                          "std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool, std::optional<Network>) const"
                         );
          }
          uVar11 = RandomMixin<FastRandomContext>::randbits<30>
                             (&this_00->super_RandomMixin<FastRandomContext>);
          auVar28._8_4_ = (int)(uVar11 >> 0x20);
          auVar28._0_8_ = uVar11;
          auVar28._12_4_ = 0x45300000;
          tVar15 = NodeClock::now();
          p_Var2 = p_Var26[9]._M_nxt;
          iVar24 = *(int *)&p_Var26[0x10]._M_nxt;
          if (7 < iVar24) {
            iVar24 = 8;
          }
          dVar27 = pow(0.66,(double)iVar24);
          if (dVar27 * *(double *)
                        (&DAT_00fba730 +
                        (ulong)((long)tVar15.__d.__r / 1000000000 - (long)p_Var2 < 600) * 8) * dVar4
              * 1073741824.0 <=
              (auVar28._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)) {
            dVar4 = dVar4 * 1.2;
            bVar8 = false;
          }
          else {
            unaff_R15 = (CService *)(p_Var26 + 2);
            pLVar16 = LogInstance();
            bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar16,ADDRMAN,Debug);
            if (bVar8) {
              CService::ToStringAddrPort_abi_cxx11_((string *)(local_108 + 0x10),unaff_R15);
              local_108._0_8_ = pcVar19;
              pLVar16 = LogInstance();
              bVar8 = BCLog::Logger::Enabled(pLVar16);
              if (bVar8) {
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                local_58._M_string_length = 0;
                local_58.field_2._M_local_buf[0] = '\0';
                tinyformat::format<std::__cxx11::string,char_const*>
                          (&local_78,(tinyformat *)"Selected %s from %s\n",local_108 + 0x10,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108,(char **)in_R8);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&local_58,&local_78);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
                pLVar16 = LogInstance();
                local_78._M_dataplus._M_p = (pointer)0x54;
                local_78._M_string_length = 0xfba758;
                source_file._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                ;
                source_file._M_len = 0x54;
                str._M_str = local_58._M_dataplus._M_p;
                str._M_len = local_58._M_string_length;
                logging_function._M_str = "Select_";
                logging_function._M_len = 7;
                in_R8 = "Select_";
                BCLog::Logger::LogPrintStr
                          (pLVar16,str,logging_function,source_file,0x30c,ADDRMAN,Debug);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                           local_58.field_2._M_local_buf[0]) + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._16_8_ != local_e8) {
                operator_delete((void *)local_108._16_8_,local_e8[0]._M_allocated_capacity + 1);
              }
            }
            prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)__return_storage_ptr__,
                       (prevector<16U,_unsigned_char,_unsigned_int,_int> *)unaff_R15);
            *(_Hash_node_base **)
             &(__return_storage_ptr__->first).super_CService.super_CNetAddr.m_net =
                 p_Var26[5]._M_nxt;
            (__return_storage_ptr__->first).super_CService.port = *(uint16_t *)&p_Var26[6]._M_nxt;
            p_Var2 = p_Var26[8]._M_nxt;
            (__return_storage_ptr__->first).nTime.__d.__r = (rep)p_Var26[7]._M_nxt;
            (__return_storage_ptr__->first).nServices = (ServiceFlags)p_Var2;
            (__return_storage_ptr__->second).__d.__r = (rep)p_Var26[9]._M_nxt;
            bVar8 = true;
          }
        }
      } while (!bVar8);
    }
    else {
      in_R8 = (char *)(this->m_network_counts)._M_h._M_buckets;
      uVar1 = (this->m_network_counts)._M_h._M_bucket_count;
      uVar20 = ((ulong)network.super__Optional_base<Network,_true,_true>._M_payload.
                       super__Optional_payload_base<Network> & 0xffffffff) % uVar1;
      p_Var26 = ((__node_base_ptr)((long)in_R8 + uVar20 * 8))->_M_nxt;
      p_Var23 = (__node_base_ptr)0x0;
      if ((p_Var26 != (__node_base_ptr)0x0) &&
         (in_R8 = (char *)p_Var26->_M_nxt, p_Var23 = p_Var26,
         *(Network *)&((__node_base_ptr)((long)in_R8 + 8))->_M_nxt != _Var17._M_value)) {
        while (p_Var26 = (__node_base_ptr)in_R8, in_R8 = (char *)p_Var26->_M_nxt,
              (__node_base_ptr)in_R8 != (__node_base_ptr)0x0) {
          p_Var23 = (__node_base_ptr)0x0;
          if (((ulong)*(Network *)&((__node_base_ptr)((long)in_R8 + 8))->_M_nxt % uVar1 != uVar20)
             || (p_Var23 = p_Var26,
                *(Network *)&((__node_base_ptr)((long)in_R8 + 8))->_M_nxt == _Var17._M_value))
          goto LAB_0085ce03;
        }
        p_Var23 = (__node_base_ptr)0x0;
      }
LAB_0085ce03:
      if (p_Var23 == (__node_base_ptr)0x0) {
        unaff_R15 = (CService *)0x0;
      }
      else {
        unaff_R15 = (CService *)p_Var23->_M_nxt;
      }
      if (unaff_R15 != (CService *)0x0) {
        lVar22 = *(long *)&(unaff_R15->super_CNetAddr).m_addr._size;
        p_Var26 = *(__node_base_ptr *)&(unaff_R15->super_CNetAddr).m_net;
        goto LAB_0085ce4e;
      }
      CService::CService((CService *)__return_storage_ptr__);
      (__return_storage_ptr__->first).nTime.__d.__r = 100000000;
      (__return_storage_ptr__->first).nServices = NODE_NONE;
      (__return_storage_ptr__->second).__d.__r = 0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0085d746:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool new_only, std::optional<Network> network) const
{
    AssertLockHeld(cs);

    if (vRandom.empty()) return {};

    size_t new_count = nNew;
    size_t tried_count = nTried;

    if (network.has_value()) {
        auto it = m_network_counts.find(*network);
        if (it == m_network_counts.end()) return {};

        auto counts = it->second;
        new_count = counts.n_new;
        tried_count = counts.n_tried;
    }

    if (new_only && new_count == 0) return {};
    if (new_count + tried_count == 0) return {};

    // Decide if we are going to search the new or tried table
    // If either option is viable, use a 50% chance to choose
    bool search_tried;
    if (new_only || tried_count == 0) {
        search_tried = false;
    } else if (new_count == 0) {
        search_tried = true;
    } else {
        search_tried = insecure_rand.randbool();
    }

    const int bucket_count{search_tried ? ADDRMAN_TRIED_BUCKET_COUNT : ADDRMAN_NEW_BUCKET_COUNT};

    // Loop through the addrman table until we find an appropriate entry
    double chance_factor = 1.0;
    while (1) {
        // Pick a bucket, and an initial position in that bucket.
        int bucket = insecure_rand.randrange(bucket_count);
        int initial_position = insecure_rand.randrange(ADDRMAN_BUCKET_SIZE);

        // Iterate over the positions of that bucket, starting at the initial one,
        // and looping around.
        int i, position, node_id;
        for (i = 0; i < ADDRMAN_BUCKET_SIZE; ++i) {
            position = (initial_position + i) % ADDRMAN_BUCKET_SIZE;
            node_id = GetEntry(search_tried, bucket, position);
            if (node_id != -1) {
                if (network.has_value()) {
                    const auto it{mapInfo.find(node_id)};
                    if (Assume(it != mapInfo.end()) && it->second.GetNetwork() == *network) break;
                } else {
                    break;
                }
            }
        }

        // If the bucket is entirely empty, start over with a (likely) different one.
        if (i == ADDRMAN_BUCKET_SIZE) continue;

        // Find the entry to return.
        const auto it_found{mapInfo.find(node_id)};
        assert(it_found != mapInfo.end());
        const AddrInfo& info{it_found->second};

        // With probability GetChance() * chance_factor, return the entry.
        if (insecure_rand.randbits<30>() < chance_factor * info.GetChance() * (1 << 30)) {
            LogDebug(BCLog::ADDRMAN, "Selected %s from %s\n", info.ToStringAddrPort(), search_tried ? "tried" : "new");
            return {info, info.m_last_try};
        }

        // Otherwise start over with a (likely) different bucket, and increased chance factor.
        chance_factor *= 1.2;
    }
}